

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_rawLiteralsCost_cached
              (cachedLiteralPrice_t *cachedLitPrice,BYTE *anchor,U32 litlen,optState_t *optStatePtr)

{
  U32 UVar1;
  U32 UVar2;
  BYTE *literals;
  
  UVar1 = 0;
  literals = anchor;
  UVar2 = litlen;
  if (cachedLitPrice->anchor == anchor) {
    UVar1 = cachedLitPrice->rawLitCost;
    UVar2 = litlen - cachedLitPrice->litlen;
    literals = anchor + cachedLitPrice->litlen;
  }
  UVar2 = ZSTD_rawLiteralsCost(literals,UVar2,optStatePtr);
  cachedLitPrice->anchor = anchor;
  cachedLitPrice->litlen = litlen;
  cachedLitPrice->rawLitCost = UVar2 + UVar1;
  return UVar2 + UVar1;
}

Assistant:

static U32 ZSTD_rawLiteralsCost_cached(
                            cachedLiteralPrice_t* const cachedLitPrice,
                            const BYTE* const anchor, U32 const litlen,
                            const optState_t* const optStatePtr)
{
    U32 startCost;
    U32 remainingLength;
    const BYTE* startPosition;

    if (anchor == cachedLitPrice->anchor) {
        startCost = cachedLitPrice->rawLitCost;
        startPosition = anchor + cachedLitPrice->litlen;
        assert(litlen >= cachedLitPrice->litlen);
        remainingLength = litlen - cachedLitPrice->litlen;
    } else {
        startCost = 0;
        startPosition = anchor;
        remainingLength = litlen;
    }

    {   U32 const rawLitCost = startCost + ZSTD_rawLiteralsCost(startPosition, remainingLength, optStatePtr);
        cachedLitPrice->anchor = anchor;
        cachedLitPrice->litlen = litlen;
        cachedLitPrice->rawLitCost = rawLitCost;
        return rawLitCost;
    }
}